

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLScanner.cpp
# Opt level: O1

XMLTokens __thiscall xercesc_4_0::XMLScanner::senseNextToken(XMLScanner *this,XMLSize_t *orgReader)

{
  ReaderMgr *this_00;
  XMLReader *pXVar1;
  bool bVar2;
  XMLCh XVar3;
  XMLTokens XVar4;
  
  this_00 = &this->fReaderMgr;
  pXVar1 = (this->fReaderMgr).fCurReader;
  if ((pXVar1 == (XMLReader *)0x0) || (pXVar1->fCharsAvail == pXVar1->fCharIndex)) {
    bVar2 = (this->fReaderMgr).fThrowEOE;
    (this->fReaderMgr).fThrowEOE = true;
    XVar3 = ReaderMgr::peekNextChar(this_00);
    (this->fReaderMgr).fThrowEOE = bVar2;
  }
  else {
    XVar3 = ReaderMgr::peekNextChar(this_00);
  }
  if (XVar3 == L'<') {
    ReaderMgr::getNextChar(this_00);
    *orgReader = ((this->fReaderMgr).fCurReader)->fReaderNum;
    XVar3 = ReaderMgr::peekNextChar(this_00);
    if (XVar3 == L'!') {
      bVar2 = XMLReader::skippedString((this->fReaderMgr).fCurReader,L"![CDATA");
      XVar4 = Token_CData;
      if (!bVar2) {
        bVar2 = XMLReader::skippedString((this->fReaderMgr).fCurReader,L"!--");
        XVar4 = Token_Comment;
        if (!bVar2) {
          emitError(this,ExpectedCommentOrCDATA);
          XVar4 = Token_Unknown;
        }
      }
    }
    else if (XVar3 == L'?') {
      ReaderMgr::getNextChar(this_00);
      XVar4 = Token_PI;
    }
    else {
      XVar4 = Token_StartTag;
      if (XVar3 == L'/') {
        ReaderMgr::getNextChar(this_00);
        XVar4 = Token_EndTag;
      }
    }
  }
  else {
    XVar4 = (uint)(XVar3 == L'\0') * 3 + Token_CharData;
  }
  return XVar4;
}

Assistant:

XMLScanner::XMLTokens XMLScanner::senseNextToken(XMLSize_t& orgReader)
{
    //  Get the next character and use it to guesstimate what the next token
    //  is going to be. We turn on end of entity exceptions when we do this
    //  in order to catch the scenario where the current entity ended at
    //  the > of some markup.
    XMLCh nextCh=0;

    XMLReader* curReader=fReaderMgr.getCurrentReader();
    // avoid setting up the ThrowEOEJanitor if we know that we have data in the current reader
    if(curReader && curReader->charsLeftInBuffer()>0)
        nextCh = fReaderMgr.peekNextChar();
    else
    {
        ThrowEOEJanitor janMgr(&fReaderMgr, true);
        nextCh = fReaderMgr.peekNextChar();
    }

    //  If it's not a '<' we must be in content (unless it's a EOF)
    //
    //  This includes entity references '&' of some sort. These must
    //  be character data because that's the only place a reference can
    //  occur in content.
    if (nextCh != chOpenAngle)
        return nextCh?Token_CharData:Token_EOF;

    //  Ok it had to have been a '<' character. So get it out of the reader
    //  and store the reader number where we saw it, passing it back to the
    //  caller.
    fReaderMgr.getNextChar();
    orgReader = fReaderMgr.getCurrentReaderNum();

    //  Ok, so lets go through the things that it could be at this point which
    //  are all some form of markup.
    switch(fReaderMgr.peekNextChar())
    {
    case chForwardSlash:
        {
            fReaderMgr.getNextChar();
            return Token_EndTag;
        }
    case chBang:
        {
            static const XMLCh gCDATAStr[] =
            {
                    chBang, chOpenSquare, chLatin_C, chLatin_D, chLatin_A
                ,   chLatin_T, chLatin_A, chNull
            };

            static const XMLCh gCommentString[] =
            {
                chBang, chDash, chDash, chNull
            };

            if (fReaderMgr.skippedString(gCDATAStr))
                return Token_CData;

            if (fReaderMgr.skippedString(gCommentString))
                return Token_Comment;

            emitError(XMLErrs::ExpectedCommentOrCDATA);
            return Token_Unknown;
        }
    case chQuestion:
        {
            // It must be a PI
            fReaderMgr.getNextChar();
            return Token_PI;
        }
    }
    //  Assume its an element name, so return with a start tag token. If it
    //  turns out not to be, then it will fail when it cannot get a valid tag.
    return Token_StartTag;
}